

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRect __thiscall QDockAreaLayoutInfo::itemRect(QDockAreaLayoutInfo *this,int index,bool isGap)

{
  Orientation OVar1;
  QSize QVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  quintptr qVar7;
  QSize QVar8;
  quintptr qVar9;
  Representation RVar10;
  ulong uVar11;
  uint uVar12;
  Representation RVar13;
  QDockAreaLayoutItem *this_00;
  ulong uVar14;
  int iVar15;
  QRect QVar16;
  QRect QVar17;
  undefined4 extraout_var;
  
  this_00 = (this->item_list).d.ptr + index;
  bVar3 = QDockAreaLayoutItem::skip(this_00);
  QVar16 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  if (bVar3) {
    uVar14 = 0;
    uVar11 = 0xffffffff;
    QVar16 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    goto LAB_003c8d3f;
  }
  if (isGap) {
    uVar14 = 0;
    uVar11 = 0xffffffff;
    if ((this_00->flags & 1) == 0) goto LAB_003c8d3f;
    if (this->tabbed != false) goto LAB_003c8d23;
    uVar12 = this_00->pos;
    iVar15 = this_00->size;
    iVar4 = prev(this,index);
    iVar5 = next(this,index);
    if ((iVar4 != -1) && (((this->item_list).d.ptr[iVar4].flags & 1) == 0)) {
      uVar12 = uVar12 + *this->sep;
      iVar15 = iVar15 - *this->sep;
    }
    if ((iVar5 != -1) && (((this->item_list).d.ptr[iVar5].flags & 1) == 0)) {
      iVar15 = iVar15 - *this->sep;
    }
  }
  else {
    if (this->tabbed != false) {
      QVar16 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      if (this_00->widgetItem == (QLayoutItem *)0x0) {
        qVar7 = 0;
      }
      else {
        iVar15 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
        qVar7 = CONCAT44(extraout_var,iVar15);
      }
      qVar9 = currentTabId(this);
      uVar14 = 0;
      uVar11 = 0xffffffff;
      if (qVar7 != qVar9) goto LAB_003c8d3f;
LAB_003c8d23:
      QVar16 = tabContentRect(this);
      uVar14 = QVar16._0_8_ >> 0x20;
      uVar11 = QVar16._8_8_ >> 0x20;
      goto LAB_003c8d3f;
    }
    uVar12 = this_00->pos;
    iVar15 = this_00->size;
  }
  OVar1 = this->o;
  uVar14 = (ulong)uVar12;
  if (OVar1 == Horizontal) {
    uVar14 = 0;
  }
  uVar11._0_4_ = (this->rect).x1;
  uVar11._4_4_ = (this->rect).y1;
  if (OVar1 == Vertical) {
    RVar13.m_i = -1;
  }
  else {
    uVar14 = uVar11 >> 0x20;
    uVar6 = 0;
    if (OVar1 == Horizontal) {
      uVar6 = uVar12;
    }
    iVar4 = iVar15;
    RVar13.m_i = -1;
    if (OVar1 == Horizontal) {
      iVar4 = -1;
      RVar13.m_i = iVar15;
    }
    iVar15 = iVar4;
    uVar11 = (ulong)uVar6;
  }
  QVar8 = QRect::size(&this->rect);
  QVar2 = (QSize)((ulong)QVar8 >> 0x20);
  if (OVar1 == Vertical) {
    QVar2 = QVar8;
  }
  RVar10.m_i = QVar2.wd.m_i.m_i;
  if (this->o == Vertical) {
    RVar10.m_i = iVar15;
    RVar13.m_i = QVar2.wd.m_i.m_i;
  }
  QVar16.x2.m_i = (int)uVar11 + RVar13.m_i + -1;
  QVar16.x1.m_i = (int)uVar11;
  QVar16.y1.m_i = (int)(uVar11 >> 0x20);
  QVar16.y2.m_i = 0;
  uVar11 = (ulong)((RVar10.m_i + (int)uVar14) - 1);
LAB_003c8d3f:
  QVar17._0_8_ = QVar16._0_8_ & 0xffffffff | uVar14 << 0x20;
  QVar17._8_8_ = QVar16._8_8_ & 0xffffffff | uVar11 << 0x20;
  return QVar17;
}

Assistant:

QRect QDockAreaLayoutInfo::itemRect(int index, bool isGap) const
{
    const QDockAreaLayoutItem &item = item_list.at(index);

    if (item.skip())
        return QRect();

    if (isGap && !(item.flags & QDockAreaLayoutItem::GapItem))
        return QRect();

    QRect result;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        if (isGap || tabId(item) == currentTabId())
            result = tabContentRect();
    } else
#endif
    {
        int pos = item.pos;
        int size = item.size;

        if (isGap) {
            int prev = this->prev(index);
            int next = this->next(index);
            if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
                pos += *sep;
                size -= *sep;
            }
            if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
                size -= *sep;
        }

        QPoint p;
        rpick(o, p) = pos;
        rperp(o, p) = perp(o, rect.topLeft());
        QSize s;
        rpick(o, s) = size;
        rperp(o, s) = perp(o, rect.size());
        result = QRect(p, s);
    }

    return result;
}